

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall
QMainWindowLayout::unplug(QMainWindowLayout *this,QWidget *widget,DragScope scope)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  Int IVar4;
  DockWidgetArea DVar5;
  QDockWidgetGroupWindow *pQVar6;
  QDockAreaLayoutInfo *pQVar7;
  QDockAreaLayoutItem *pQVar8;
  QDebug *pQVar9;
  qsizetype qVar10;
  QDockWidget *pQVar11;
  QDockWidgetLayout *pQVar12;
  QStyle *pQVar13;
  QToolBar *pQVar14;
  int in_EDX;
  QWidget *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QToolBar *tb;
  int minWidth;
  int minHeight;
  int tbHeight;
  bool verticalTitleBar;
  QDockWidgetLayout *layout;
  QDockWidget *dw;
  QDockWidget *dockWidget;
  QDockAreaLayoutInfo *info;
  QDockWidgetGroupWindow *groupWindow;
  QRect r;
  QLayoutItem *item;
  QList<int> path;
  QLayoutItem *item_1;
  QList<int> path_1;
  QList<int> groupWindowPath;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QDockAreaLayoutItem parentItem;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QMainWindowLayoutState *in_stack_fffffffffffffd38;
  QMainWindowLayoutState *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  int iVar15;
  int in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  uint uVar16;
  QMainWindowLayoutState *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  QMainWindowLayoutState *in_stack_fffffffffffffd70;
  QMainWindowLayout *in_stack_fffffffffffffd78;
  QMainWindowLayout *in_stack_fffffffffffffd80;
  QWidget *in_stack_fffffffffffffdb8;
  QDebug *in_stack_fffffffffffffdc0;
  QLayoutItem *local_208;
  QDebug local_1d8;
  QDebug local_1d0;
  QDebug local_1c8;
  QDebug local_1c0 [2];
  QSize local_1b0;
  QSize local_1a8;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_184;
  undefined1 local_180 [16];
  QLayoutItem *local_170;
  QList<int> local_168 [2];
  QDebug local_130;
  QDebug local_128;
  QDebug local_120 [5];
  QDebug local_f8;
  QDebug local_f0;
  QDebug local_e8;
  QLayoutItem *local_e0;
  QList<int> local_d8 [2];
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QLayoutItem *local_40 [5];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::parentWidget((QWidget *)0x5f277d);
  pQVar6 = qobject_cast<QDockWidgetGroupWindow_const*>((QObject *)0x5f2785);
  bVar3 = QWidget::isWindow((QWidget *)in_stack_fffffffffffffd40);
  if ((bVar3) || (pQVar6 == (QDockWidgetGroupWindow *)0x0)) {
    local_168[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_168[0].d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_168[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QMainWindowLayoutState::indexOf
              (in_stack_fffffffffffffd70,
               (QWidget *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    bVar3 = QList<int>::isEmpty((QList<int> *)0x5f2e10);
    if (bVar3) {
      local_208 = (QLayoutItem *)0x0;
    }
    else {
      local_170 = QMainWindowLayoutState::item
                            (in_stack_fffffffffffffd70,
                             (QList<int> *)
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      bVar3 = QWidget::isWindow((QWidget *)in_stack_fffffffffffffd40);
      if (bVar3) {
        local_208 = local_170;
      }
      else {
        local_180._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_180._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_180 = (undefined1  [16])
                    QMainWindowLayoutState::itemRect
                              ((QMainWindowLayoutState *)
                               CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                               (QList<int> *)in_stack_fffffffffffffd60);
        QMainWindowLayoutState::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        pQVar11 = qobject_cast<QDockWidget*>((QObject *)0x5f2ef5);
        if (pQVar11 != (QDockWidget *)0x0) {
          bVar3 = false;
          in_stack_fffffffffffffd6f = false;
          if (in_EDX == 0) {
            local_184.super_QFlagsStorage<QMainWindow::DockOption>.i =
                 (QFlagsStorage<QMainWindow::DockOption>)
                 QFlags<QMainWindow::DockOption>::operator&
                           ((QFlags<QMainWindow::DockOption> *)in_stack_fffffffffffffd40,
                            (DockOption)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_184);
            in_stack_fffffffffffffd6f = false;
            if (IVar4 != 0) {
              qVar10 = QList<int>::size(local_168);
              in_stack_fffffffffffffd6f = false;
              if (3 < qVar10) {
                in_stack_fffffffffffffd60 = (QMainWindowLayoutState *)(in_RDI + 0x1a0);
                QList<int>::size(local_168);
                QList<int>::mid((QList<int> *)in_stack_fffffffffffffd70,
                                CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                                (qsizetype)in_stack_fffffffffffffd60);
                bVar3 = true;
                QDockAreaLayout::item
                          ((QDockAreaLayout *)in_stack_fffffffffffffd60,
                           (QList<int> *)
                           CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
                in_stack_fffffffffffffd6f =
                     unplugGroup(in_stack_fffffffffffffd78,(QLayoutItem **)in_stack_fffffffffffffd70
                                 ,(QDockAreaLayoutItem *)
                                  CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
              }
            }
          }
          uVar16 = CONCAT13(in_stack_fffffffffffffd6f,(int3)in_stack_fffffffffffffd5c);
          if (bVar3) {
            QList<int>::~QList((QList<int> *)0x5f3010);
          }
          if ((uVar16 & 0x1000000) == 0) {
            DVar5 = dockWidgetArea((QMainWindowLayout *)
                                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                   (QWidget *)in_stack_fffffffffffffd40);
            if (DVar5 != NoDockWidgetArea) {
              if (DVar5 - LeftDockWidgetArea < 2) {
                QRect::height(&in_stack_fffffffffffffd38->rect);
                QRect::setHeight(&in_stack_fffffffffffffd40->rect,
                                 (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
              }
              else if ((DVar5 == TopDockWidgetArea) || (DVar5 == BottomDockWidgetArea)) {
                QRect::width(&in_stack_fffffffffffffd38->rect);
                QRect::setWidth(&in_stack_fffffffffffffd40->rect,
                                (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
              }
            }
            QWidget::layout((QWidget *)0x5f30f8);
            pQVar12 = qobject_cast<QDockWidgetLayout*>((QObject *)0x5f3100);
            if (pQVar12 == (QDockWidgetLayout *)0x0) {
              in_stack_fffffffffffffd54 = in_stack_fffffffffffffd54 & 0xffffff;
            }
            else {
              in_stack_fffffffffffffd54 =
                   CONCAT13((pQVar12->super_QLayout).super_QLayoutItem.field_0xc,
                            (int3)in_stack_fffffffffffffd54);
            }
            uVar1 = in_stack_fffffffffffffd54 & 0x1000000;
            uVar2 = in_stack_fffffffffffffd54 & 0x1000000;
            pQVar13 = QApplication::style();
            if (pQVar13 == (QStyle *)0x0) {
              in_stack_fffffffffffffd50 = 0x14;
            }
            else {
              pQVar13 = QApplication::style();
              in_stack_fffffffffffffd50 =
                   (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x1a,0,pQVar11);
            }
            in_stack_fffffffffffffd4c = in_stack_fffffffffffffd50;
            if (uVar1 != 0) {
              in_stack_fffffffffffffd4c = in_stack_fffffffffffffd50 << 1;
            }
            iVar15 = in_stack_fffffffffffffd50;
            if (uVar2 == 0) {
              iVar15 = in_stack_fffffffffffffd50 << 1;
            }
            local_1b0 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffd54,
                                                      in_stack_fffffffffffffd50));
            QSize::QSize((QSize *)in_stack_fffffffffffffd40,
                         (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                         (int)in_stack_fffffffffffffd38);
            local_1a8 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffd4c,iVar15),
                                          (QSize *)in_stack_fffffffffffffd40);
            QRect::setSize((QRect *)CONCAT44(uVar16,DVar5),
                           (QSize *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
            local_70 = &DAT_aaaaaaaaaaaaaaaa;
            local_68 = &DAT_aaaaaaaaaaaaaaaa;
            QtPrivateLogging::lcQpaDockWidgets();
            anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffd40,
                       (QLoggingCategory *)in_stack_fffffffffffffd38);
            while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_70), bVar3) {
              anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x5f3269);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)
                         CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (char *)CONCAT44(in_stack_fffffffffffffd4c,iVar15),
                         (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                         (char *)in_stack_fffffffffffffd38,(char *)0x5f3282);
              QMessageLogger::debug();
              ::operator<<((QDebug *)in_stack_fffffffffffffd70,
                           (QDockWidget *)
                           CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
              pQVar9 = QDebug::operator<<((QDebug *)CONCAT44(uVar16,DVar5),in_RDI);
              QDebug::QDebug(&local_1c8,pQVar9);
              QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
              ::operator<<((QDebug *)local_1c0,(QSize *)&local_1c8);
              QDebug::~QDebug(local_1c0);
              QDebug::~QDebug(&local_1c8);
              QDebug::~QDebug(&local_1d0);
              QDebug::~QDebug(&local_1d8);
              local_68 = (undefined1 *)((ulong)local_68 & 0xffffffffffffff00);
            }
            QDockWidget::d_func((QDockWidget *)0x5f3358);
            QDockWidgetPrivate::unplug
                      ((QDockWidgetPrivate *)
                       CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                       &in_stack_fffffffffffffd60->rect);
          }
          else {
            QList<int>::removeLast((QList<int> *)in_stack_fffffffffffffd40);
            QMainWindowLayoutState::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          }
        }
        pQVar14 = qobject_cast<QToolBar*>((QObject *)0x5f3377);
        if (pQVar14 != (QToolBar *)0x0) {
          QToolBar::d_func((QToolBar *)0x5f338e);
          QToolBarPrivate::unplug
                    ((QToolBarPrivate *)
                     CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                     &in_stack_fffffffffffffd60->rect);
        }
        QMainWindowLayoutState::unplug
                  (in_stack_fffffffffffffd70,
                   (QList<int> *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   in_stack_fffffffffffffd60);
        QMainWindowLayoutState::fitLayout(in_stack_fffffffffffffd38);
        QList<int>::operator=
                  ((QList<int> *)in_stack_fffffffffffffd40,(QList<int> *)in_stack_fffffffffffffd38);
        *(undefined8 *)(in_RDI + 0x7c8) = local_180._0_8_;
        *(undefined8 *)(in_RDI + 2000) = local_180._8_8_;
        updateGapIndicator(in_stack_fffffffffffffd80);
        QList<int>::at((QList<int> *)local_170,(qsizetype)in_stack_fffffffffffffd38);
        fixToolBarOrientation
                  ((QLayoutItem *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd4c);
        local_208 = local_170;
      }
    }
    QList<int>::~QList((QList<int> *)0x5f346a);
  }
  else if ((in_EDX == 0) &&
          (pQVar7 = QDockWidgetGroupWindow::tabLayoutInfo
                              ((QDockWidgetGroupWindow *)
                               CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68)),
          pQVar7 != (QDockAreaLayoutInfo *)0x0)) {
    QWidget::parentWidget((QWidget *)0x5f27e3);
    pQVar7 = dockInfo(in_stack_fffffffffffffd78,(QWidget *)in_stack_fffffffffffffd70);
    if (pQVar7 == (QDockAreaLayoutInfo *)0x0) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaDockWidgets();
      anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffd40,
                 (QLoggingCategory *)in_stack_fffffffffffffd38);
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar3) {
        anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x5f2911);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),(char *)in_stack_fffffffffffffd38
                   ,(char *)0x5f292a);
        QMessageLogger::debug();
        pQVar9 = QDebug::operator<<((QDebug *)
                                    CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                    in_RDI);
        QDebug::QDebug(&local_98,pQVar9);
        ::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_RDI);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffd40,
                           SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
        QDebug::~QDebug(&local_90);
        QDebug::~QDebug(&local_98);
        QDebug::~QDebug(&local_a0);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
      local_208 = (QLayoutItem *)0x0;
    }
    else {
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      QWidget::parentWidget((QWidget *)0x5f284e);
      QDockAreaLayoutInfo::indexOf
                ((QDockAreaLayoutInfo *)in_stack_fffffffffffffd78,
                 (QWidget *)in_stack_fffffffffffffd70);
      bVar3 = QList<int>::isEmpty((QList<int> *)0x5f2870);
      if (bVar3) {
        local_208 = (QLayoutItem *)0x0;
      }
      else {
        pQVar8 = QDockAreaLayoutInfo::item
                           ((QDockAreaLayoutInfo *)
                            CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                            (QList<int> *)in_stack_fffffffffffffd60);
        local_208 = pQVar8->widgetItem;
      }
      QList<int>::~QList((QList<int> *)0x5f28b6);
    }
  }
  else {
    local_d8[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8[0].d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5f2a2c);
    QDockAreaLayoutInfo::indexOf
              ((QDockAreaLayoutInfo *)in_stack_fffffffffffffd78,(QWidget *)in_stack_fffffffffffffd70
              );
    memset(local_40,0xaa,0x28);
    QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5f2a68);
    QDockAreaLayoutInfo::item
              ((QDockAreaLayoutInfo *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
               (QList<int> *)in_stack_fffffffffffffd60);
    QDockAreaLayoutItem::QDockAreaLayoutItem
              ((QDockAreaLayoutItem *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (QDockAreaLayoutItem *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48))
    ;
    local_e0 = local_40[0];
    if ((in_EDX == 0) &&
       ((qVar10 = QList<int>::size(local_d8), 1 < qVar10 &&
        (bVar3 = unplugGroup(in_stack_fffffffffffffd78,(QLayoutItem **)in_stack_fffffffffffffd70,
                             (QDockAreaLayoutItem *)
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68)), bVar3))
       )) {
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaDockWidgets();
      anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffd40,
                 (QLoggingCategory *)in_stack_fffffffffffffd38);
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_50), bVar3) {
        anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x5f2b36);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),(char *)in_stack_fffffffffffffd38
                   ,(char *)0x5f2b4f);
        QMessageLogger::debug();
        pQVar9 = QDebug::operator<<((QDebug *)
                                    CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                    in_RDI);
        QDebug::QDebug(&local_f0,pQVar9);
        ::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_RDI);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        QDebug::~QDebug(&local_e8);
        QDebug::~QDebug(&local_f0);
        QDebug::~QDebug(&local_f8);
        local_48 = (undefined1 *)((ulong)local_48 & 0xffffffffffffff00);
      }
    }
    else {
      pQVar11 = qobject_cast<QDockWidget*>((QObject *)0x5f2c2a);
      QDockWidget::d_func((QDockWidget *)0x5f2c3f);
      QWidget::geometry(in_RSI);
      QDockWidgetPrivate::unplug
                ((QDockWidgetPrivate *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68)
                 ,&in_stack_fffffffffffffd60->rect);
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaDockWidgets();
      anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffd40,
                 (QLoggingCategory *)in_stack_fffffffffffffd38);
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_60), bVar3) {
        anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x5f2cb4);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),(char *)in_stack_fffffffffffffd38
                   ,(char *)0x5f2ccd);
        QMessageLogger::debug();
        pQVar9 = QDebug::operator<<((QDebug *)
                                    CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                    in_RDI);
        QDebug::QDebug(&local_128,pQVar9);
        ::operator<<((QDebug *)pQVar11,in_stack_fffffffffffffdb8);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_RDI);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        QDebug::~QDebug(local_120);
        QDebug::~QDebug(&local_128);
        QDebug::~QDebug(&local_130);
        local_58 = (undefined1 *)((ulong)local_58 & 0xffffffffffffff00);
      }
    }
    local_208 = local_e0;
    QDockAreaLayoutItem::~QDockAreaLayoutItem
              ((QDockAreaLayoutItem *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
    ;
    QList<int>::~QList((QList<int> *)0x5f2db0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_208;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayout::unplug(QWidget *widget, QDockWidgetPrivate::DragScope scope)
{
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    auto *groupWindow = qobject_cast<const QDockWidgetGroupWindow *>(widget->parentWidget());
    if (!widget->isWindow() && groupWindow) {
        if (scope == QDockWidgetPrivate::DragScope::Group && groupWindow->tabLayoutInfo()) {
            // We are just dragging a floating window as it, not need to do anything, we just have to
            // look up the corresponding QWidgetItem* if it exists
            if (QDockAreaLayoutInfo *info = dockInfo(widget->parentWidget())) {
                QList<int> groupWindowPath = info->indexOf(widget->parentWidget());
                return groupWindowPath.isEmpty() ? nullptr : info->item(groupWindowPath).widgetItem;
            }
            qCDebug(lcQpaDockWidgets) << "Drag only:" << widget << "Group:" << (scope == QDockWidgetPrivate::DragScope::Group);
            return nullptr;
        }
        QList<int> path = groupWindow->layoutInfo()->indexOf(widget);
        QDockAreaLayoutItem parentItem = groupWindow->layoutInfo()->item(path);
        QLayoutItem *item = parentItem.widgetItem;
        if (scope == QDockWidgetPrivate::DragScope::Group && path.size() > 1
            && unplugGroup(this, &item, parentItem)) {
            qCDebug(lcQpaDockWidgets) << "Unplugging:" << widget << "from" << item;
            return item;
        } else {
            // We are unplugging a single dock widget from a floating window.
            QDockWidget *dockWidget = qobject_cast<QDockWidget *>(widget);
            Q_ASSERT(dockWidget); // cannot be a QDockWidgetGroupWindow because it's not floating.
            dockWidget->d_func()->unplug(widget->geometry());

            qCDebug(lcQpaDockWidgets) << "Unplugged from floating dock:" << widget << "from" << parentItem.widgetItem;
            return item;
        }
    }
#endif
    QList<int> path = layoutState.indexOf(widget);
    if (path.isEmpty())
        return nullptr;

    QLayoutItem *item = layoutState.item(path);
    if (widget->isWindow())
        return item;

    QRect r = layoutState.itemRect(path);
    savedState = layoutState;

#if QT_CONFIG(dockwidget)
    if (QDockWidget *dw = qobject_cast<QDockWidget*>(widget)) {
        Q_ASSERT(path.constFirst() == 1);
#if QT_CONFIG(tabwidget)
        if (scope == QDockWidgetPrivate::DragScope::Group && (dockOptions & QMainWindow::GroupedDragging) && path.size() > 3
            && unplugGroup(this, &item,
                           layoutState.dockAreaLayout.item(path.mid(1, path.size() - 2)))) {
            path.removeLast();
            savedState = layoutState;
        } else
#endif // QT_CONFIG(tabwidget)
        {
            // Dock widget is unplugged from a main window dock
            // => height or width need to be decreased by separator size
            switch (dockWidgetArea(dw)) {
            case Qt::LeftDockWidgetArea:
            case Qt::RightDockWidgetArea:
                r.setHeight(r.height() - sep);
                break;
            case Qt::TopDockWidgetArea:
            case Qt::BottomDockWidgetArea:
                r.setWidth(r.width() - sep);
                break;
            case Qt::NoDockWidgetArea:
            case Qt::DockWidgetArea_Mask:
                break;
            }

            // Depending on the title bar layout (vertical / horizontal),
            // width and height have to provide minimum space for window handles
            // and mouse dragging.
            // Assuming horizontal title bar, if the dock widget does not have a layout.
            const auto *layout = qobject_cast<QDockWidgetLayout *>(dw->layout());
            const bool verticalTitleBar = layout ? layout->verticalTitleBar : false;
            const int tbHeight = QApplication::style()
                      ? QApplication::style()->pixelMetric(QStyle::PixelMetric::PM_TitleBarHeight, nullptr, dw)
                      : 20;
            const int minHeight = verticalTitleBar ? 2 * tbHeight : tbHeight;
            const int minWidth = verticalTitleBar ? tbHeight : 2 * tbHeight;
            r.setSize(r.size().expandedTo(QSize(minWidth, minHeight)));
            qCDebug(lcQpaDockWidgets) << dw << "will be unplugged with size" << r.size();

            dw->d_func()->unplug(r);
        }
    }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
    if (QToolBar *tb = qobject_cast<QToolBar*>(widget)) {
        tb->d_func()->unplug(r);
    }
#endif

#if !QT_CONFIG(dockwidget) || !QT_CONFIG(tabbar)
    Q_UNUSED(scope);
#endif

    layoutState.unplug(path ,&savedState);
    savedState.fitLayout();
    currentGapPos = path;
    currentGapRect = r;
    updateGapIndicator();

    fixToolBarOrientation(item, currentGapPos.at(1));

    return item;
}